

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

void dropx(obj *obj)

{
  boolean bVar1;
  
  if (obj->where == '\x03') {
    if (obj->oclass == '\f') {
      iflags.botl = '\x01';
    }
    freeinv(obj);
  }
  if ((u._1052_1_ & 1) == 0) {
    bVar1 = ship_object(obj,u.ux,u.uy,'\0');
    if (bVar1 != '\0') {
      return;
    }
    if (level->locations[u.ux][u.uy].typ == '!') {
      doaltarobj(obj);
    }
  }
  dropy(obj);
  return;
}

Assistant:

void dropx(struct obj *obj)
{
	/* Tipped objects aren't considered carried, even if
	 * their container is, so don't freeinv() it. */
	if (carried(obj)) {
	    /* Ensure update when we drop gold objects */
	    if (obj->oclass == COIN_CLASS) iflags.botl = 1;
	    freeinv(obj);
	}
	if (!u.uswallow) {
	    if (ship_object(obj, u.ux, u.uy, FALSE)) return;
	    if (IS_ALTAR(level->locations[u.ux][u.uy].typ))
		doaltarobj(obj); /* set bknown */
	}
	dropy(obj);
}